

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O0

LispPTR * N_OP_dunbind(LispPTR *stack_pointer,LispPTR tos)

{
  uint *puVar1;
  uint uVar2;
  ushort uVar3;
  uint *puVar4;
  ushort local_22;
  LispPTR value;
  DLword i;
  LispPTR *ppvar;
  DLword num;
  LispPTR *pLStack_10;
  LispPTR tos_local;
  LispPTR *stack_pointer_local;
  
  pLStack_10 = stack_pointer;
  if ((tos & 0x80000000) == 0) {
    do {
      puVar4 = pLStack_10 + -1;
      puVar1 = pLStack_10 + -1;
      pLStack_10 = puVar4;
    } while ((*puVar1 & 0x80000000) == 0);
    uVar2 = *puVar4;
    _value = MachineState.pvar + (long)(int)(uVar2 & 0xffff) + 2;
    for (local_22 = 0; local_22 < (ushort)((ushort)(uVar2 >> 0x10) ^ 0xffff);
        local_22 = local_22 + 1) {
      _value[-2] = 0xffff;
      _value[-1] = 0xffff;
      _value = _value + -2;
    }
  }
  else {
    uVar3 = (ushort)(tos >> 0x10) ^ 0xffff;
    pLStack_10 = stack_pointer;
    if (uVar3 != 0) {
      _value = MachineState.pvar + (long)(int)(tos & 0xffff) + 2;
      for (local_22 = 0; local_22 < uVar3; local_22 = local_22 + 1) {
        _value[-2] = 0xffff;
        _value[-1] = 0xffff;
        _value = _value + -2;
      }
    }
  }
  return pLStack_10;
}

Assistant:

LispPTR *N_OP_dunbind(LispPTR *stack_pointer, LispPTR tos) {
  DLword num;     /* number of unbind sot */
  LispPTR *ppvar; /* pointer to last PVAR slot. */
  DLword i;       /* temporary for control */
  LispPTR value;

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_dunbind()\n");
#endif

  if (tos & 0x80000000) {
    /* check MSB bit of High word in tos, 1: unbound, 0: bound */

    /* tos is unbound */
    num = ~(GetHiWord(tos));
    value = 0xffffffff;
    if (num != 0) {
      ppvar = (LispPTR *)(PVar + 2 + GetLoWord(tos));
      for (i = 0; i < num; ++i) { *--ppvar = value; }
    }
  } else {
    /* tos is bound */
    /* now, stack_pointer points the latter part in slot */
    for (; !((*--stack_pointer) & 0x80000000);)
      ;
    /* scan (until MSB == 1) */

    value = *stack_pointer;
    num = ~(GetHiWord(value));
    ppvar = (LispPTR *)(PVar + 2 + GetLoWord(value));
    value = 0xffffffff;
    for (i = 0; i < num; i++) { *--ppvar = value; }
  }

  return (stack_pointer);
}